

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

tensor * __thiscall
dlib::
add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<64L,_7L,_7L,_2,_2,_0,_0>,_dlib::input_rgb_image,_void>,_void>,_void>
::private_get_gradient_input
          (add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<64L,_7L,_7L,_2,_2,_0,_0>,_dlib::input_rgb_image,_void>,_void>,_void>
           *this)

{
  bool bVar1;
  tensor *ptVar2;
  add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<64L,_7L,_7L,_2,_2,_0,_0>,_dlib::input_rgb_image,_void>,_void>
  *in_RDI;
  resizable_tensor *unaff_retaddr;
  undefined4 in_stack_ffffffffffffffd8;
  float in_stack_ffffffffffffffdc;
  add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<64L,_7L,_7L,_2,_2,_0,_0>,_dlib::input_rgb_image,_void>,_void>,_void>
  *in_stack_ffffffffffffffe0;
  resizable_tensor *this_00;
  tensor *in_stack_fffffffffffffff8;
  
  bVar1 = this_layer_operates_inplace(in_stack_ffffffffffffffe0);
  if (bVar1) {
    std::
    unique_ptr<dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<64L,_7L,_7L,_2,_2,_0,_0>,_dlib::input_rgb_image,_void>,_void>,_std::default_delete<dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<64L,_7L,_7L,_2,_2,_0,_0>,_dlib::input_rgb_image,_void>,_void>_>_>
    ::operator->((unique_ptr<dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<64L,_7L,_7L,_2,_2,_0,_0>,_dlib::input_rgb_image,_void>,_void>,_std::default_delete<dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<64L,_7L,_7L,_2,_2,_0,_0>,_dlib::input_rgb_image,_void>,_void>_>_>
                  *)0x20c86f);
    ptVar2 = add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<64L,_7L,_7L,_2,_2,_0,_0>,_dlib::input_rgb_image,_void>,_void>
             ::private_get_gradient_input(in_RDI);
  }
  else {
    if (((in_RDI->details).gamma.inst.super_tensor.m_k & 0x100) != 0) {
      *(undefined1 *)((long)&(in_RDI->details).gamma.inst.super_tensor.m_k + 1) = 0;
      this_00 = (resizable_tensor *)&(in_RDI->details).gamma.inst.super_tensor.m_nr;
      private_get_output((add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<64L,_7L,_7L,_2,_2,_0,_0>,_dlib::input_rgb_image,_void>,_void>,_void>
                          *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
      resizable_tensor::copy_size(unaff_retaddr,in_stack_fffffffffffffff8);
      resizable_tensor::operator=(this_00,in_stack_ffffffffffffffdc);
    }
    ptVar2 = (tensor *)&(in_RDI->details).gamma.inst.super_tensor.m_nr;
  }
  return ptVar2;
}

Assistant:

tensor& private_get_gradient_input() 
        { 
            if (this_layer_operates_inplace())
            {
                return subnetwork->private_get_gradient_input();
            }
            else
            {
                if (gradient_input_is_stale)
                {
                    gradient_input_is_stale = false;
                    x_grad.copy_size(private_get_output());
                    x_grad = 0;
                }
                return x_grad; 
            }
        }